

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExperimental.cxx
# Opt level: O0

bool cmExperimental::HasSupportEnabled(cmMakefile *mf,Feature f)

{
  string_view r;
  bool bVar1;
  FeatureData *this;
  cmValue l;
  cmValue value;
  FeatureData *data;
  bool enabled;
  Feature f_local;
  cmMakefile *mf_local;
  
  this = anon_unknown.dwarf_14d2656::DataForFeature(f);
  l = cmMakefile::GetDefinition(mf,&this->Variable);
  r = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)this);
  bVar1 = ::operator==(l,r);
  if ((bVar1) && ((this->Warned & 1U) == 0)) {
    cmMakefile::IssueMessage(mf,AUTHOR_WARNING,&this->Description);
    this->Warned = true;
  }
  return bVar1;
}

Assistant:

bool cmExperimental::HasSupportEnabled(cmMakefile const& mf, Feature f)
{
  bool enabled = false;
  auto& data = DataForFeature(f);

  auto value = mf.GetDefinition(data.Variable);
  if (value == data.Uuid) {
    enabled = true;
  }

  if (enabled && !data.Warned) {
    mf.IssueMessage(MessageType::AUTHOR_WARNING, data.Description);
    data.Warned = true;
  }

  return enabled;
}